

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ocsp_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *ssl_00;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pointer psVar4;
  bool local_29;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  uVar2 = ssl_protocol_version(ssl_00);
  if ((((uVar2 < 0x304) && ((*(uint *)&hs->field_0x6c8 >> 7 & 1) != 0)) &&
      ((*(ushort *)&ssl_00->s3->field_0xdc >> 5 & 1) == 0)) &&
     (bVar1 = ssl_cipher_uses_certificate_auth(hs->new_cipher), bVar1)) {
    psVar4 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                       (&hs->credential);
    bVar1 = std::operator==(&psVar4->ocsp_response,(nullptr_t)0x0);
    if (!bVar1) {
      *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xffffffbf | 0x40;
      iVar3 = CBB_add_u16(out,5);
      local_29 = false;
      if (iVar3 != 0) {
        iVar3 = CBB_add_u16(out,0);
        local_29 = iVar3 != 0;
      }
      return local_29;
    }
  }
  return true;
}

Assistant:

static bool ext_ocsp_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION ||
      !hs->ocsp_stapling_requested || ssl->s3->session_reused ||
      !ssl_cipher_uses_certificate_auth(hs->new_cipher) ||
      hs->credential->ocsp_response == nullptr) {
    return true;
  }

  hs->certificate_status_expected = true;

  return CBB_add_u16(out, TLSEXT_TYPE_status_request) &&
         CBB_add_u16(out, 0 /* length */);
}